

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetDirectoryPropertiesCommand.cxx
# Opt level: O2

bool __thiscall
cmSetDirectoryPropertiesCommand::InitialPass
          (cmSetDirectoryPropertiesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  const_iterator aitend;
  bool bVar2;
  string errors;
  allocator local_31;
  string local_30;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  aitend._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (aitend._M_current == pbVar1) {
    std::__cxx11::string::string
              ((string *)&local_30,"called with incorrect number of arguments",&local_31);
    cmCommand::SetError(&this->super_cmCommand,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    bVar2 = false;
  }
  else {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    bVar2 = RunCommand((this->super_cmCommand).Makefile,pbVar1 + 1,aitend,&local_30);
    if (!bVar2) {
      cmCommand::SetError(&this->super_cmCommand,&local_30);
    }
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar2;
}

Assistant:

bool cmSetDirectoryPropertiesCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string errors;
  bool ret =
    cmSetDirectoryPropertiesCommand::RunCommand(this->Makefile,
                                                args.begin() + 1,
                                                args.end(), errors);
  if (!ret)
    {
    this->SetError(errors);
    }
  return ret;
}